

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

int Aig_ManCountMergeRegs(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  uint local_30;
  uint local_2c;
  int Const1;
  int Const0;
  int Counter;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  Const1 = 0;
  local_2c = 0;
  local_30 = 0;
  Aig_ManIncrementTravId(p);
  iVar1 = Aig_ManCoNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (Const0 = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), Const0 < iVar1; Const0 = Const0 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Const0);
    pObj_01 = Aig_ObjFanin0(pObj_00);
    iVar1 = Aig_ObjIsConst1(pObj_01);
    if (iVar1 != 0) {
      iVar1 = Aig_ObjFaninC0(pObj_00);
      if (iVar1 == 0) {
        local_30 = local_30 + 1;
      }
      else {
        local_2c = local_2c + 1;
      }
    }
    iVar1 = Aig_ObjIsTravIdCurrent(p,pObj_01);
    if (iVar1 == 0) {
      Aig_ObjSetTravIdCurrent(p,pObj_01);
      Const1 = Const1 + 1;
    }
  }
  uVar3 = Aig_ManRegNum(p);
  printf("Regs = %d. Fanins = %d. Const0 = %d. Const1 = %d.\n",(ulong)uVar3,(ulong)(uint)Const1,
         (ulong)local_2c,(ulong)local_30);
  return 0;
}

Assistant:

int Aig_ManCountMergeRegs( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin;
    int i, Counter = 0, Const0 = 0, Const1 = 0;
    Aig_ManIncrementTravId( p );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        if ( Aig_ObjIsConst1(pFanin) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                Const0++;
            else
                Const1++;
        }
        if ( Aig_ObjIsTravIdCurrent(p, pFanin) )
            continue;
        Aig_ObjSetTravIdCurrent(p, pFanin);
        Counter++;
    }
    printf( "Regs = %d. Fanins = %d. Const0 = %d. Const1 = %d.\n", 
        Aig_ManRegNum(p), Counter, Const0, Const1 );
    return 0;
}